

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int pushline(lua_State *L,int firstline)

{
  char *pcVar1;
  int readstatus;
  char *prmt;
  size_t l;
  char *b;
  char buffer [512];
  int firstline_local;
  lua_State *L_local;
  
  pcVar1 = get_prompt(L,firstline);
  fputs(pcVar1,_stdout);
  fflush(_stdout);
  pcVar1 = fgets((char *)&b,0x200,_stdin);
  if (pcVar1 == (char *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    lua_settop(L,0xfffffffe);
    pcVar1 = (char *)strlen((char *)&b);
    prmt = pcVar1;
    if ((pcVar1 != (char *)0x0) && (*(char *)((long)&b + (long)(pcVar1 + -1)) == '\n')) {
      prmt = pcVar1 + -1;
      pcVar1[(long)&l + 7] = '\0';
    }
    if ((firstline == 0) || ((char)b != '=')) {
      lua_pushlstring(L,&b,prmt);
    }
    else {
      lua_pushfstring(L,"return %s",(long)&b + 1);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}